

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

string * __thiscall
flatbuffers::dart::DartGenerator::Filename
          (string *__return_storage_ptr__,DartGenerator *this,string *suffix,bool path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar1;
  bool bVar2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  byte local_4a;
  allocator<char> local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_21;
  string *psStack_20;
  bool path_local;
  string *suffix_local;
  DartGenerator *this_local;
  
  local_4a = 0;
  local_21 = path;
  psStack_20 = suffix;
  suffix_local = (string *)this;
  this_local = (DartGenerator *)__return_storage_ptr__;
  if (path) {
    std::__cxx11::string::string((string *)&local_48,(string *)(this->super_BaseGenerator).path_);
  }
  else {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  }
  __lhs = (this->super_BaseGenerator).file_name_;
  uVar1 = std::__cxx11::string::empty();
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  }
  else {
    std::operator+(&local_c0,"_",psStack_20);
  }
  std::operator+(&local_a0,__lhs,&local_c0);
  Namer::File(&local_80,&(this->namer_).super_Namer,&local_a0,None);
  std::operator+(__return_storage_ptr__,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (bVar2) {
    std::allocator<char>::~allocator(&local_c1);
  }
  std::__cxx11::string::~string((string *)&local_48);
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Filename(const std::string &suffix, bool path = true) const {
    return (path ? path_ : "") +
           namer_.File(file_name_ + (suffix.empty() ? "" : "_" + suffix));
  }